

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O0

int Bmc_BmciPerform(Gia_Man_t *p,Vec_Int_t *vInit0,Vec_Int_t *vInit1,int nFrames,int nWords,
                   int nTimeOut,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  sat_solver *s;
  long lVar5;
  abctime aVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  int *pMap;
  abctime aVar9;
  bool bVar10;
  int local_10c;
  int local_f4;
  abctime local_d8;
  abctime clk;
  uint local_b0;
  int RetValue;
  int nMiters;
  int nChanges;
  int status;
  int f;
  int i;
  int iLit1;
  int iLit0;
  int iLit;
  int iVar1;
  int iVar0;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Gia_Obj_t *pObj;
  Gia_Man_t *pPart;
  Gia_Man_t *pNew;
  Vec_Int_t *vCopies;
  Vec_Int_t *vPartMap;
  Vec_Int_t *vSatMap;
  Vec_Int_t *vMiters;
  Vec_Int_t *vLits1;
  Vec_Int_t *vLits0;
  int nSatVars;
  int nTimeOut_local;
  int nWords_local;
  int nFrames_local;
  Vec_Int_t *vInit1_local;
  Vec_Int_t *vInit0_local;
  Gia_Man_t *p_local;
  
  vLits0._0_4_ = 1;
  clk._4_4_ = 1;
  vLits0._4_4_ = nTimeOut;
  nSatVars = nWords;
  nTimeOut_local = nFrames;
  _nWords_local = vInit1;
  vInit1_local = vInit0;
  vInit0_local = (Vec_Int_t *)p;
  iVar2 = Vec_IntSize(vInit0);
  iVar3 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(vInit0) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xba,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  iVar2 = Vec_IntSize(_nWords_local);
  iVar3 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(vInit1) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xbb,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  s = sat_solver_new();
  _iVar1 = s;
  if (vLits0._4_4_ == 0) {
    local_d8 = 0;
  }
  else {
    lVar5 = (long)(int)vLits0._4_4_;
    aVar6 = Abc_Clock();
    local_d8 = lVar5 * 1000000 + aVar6;
  }
  sat_solver_set_runtime_limit(s,local_d8);
  pPart = Gia_ManStart(10000);
  pcVar7 = Abc_UtilStrsav(*(char **)vInit0_local);
  pPart->pName = pcVar7;
  Gia_ManHashAlloc(pPart);
  pGVar8 = Gia_ManConst0((Gia_Man_t *)vInit0_local);
  pGVar8->Value = 0;
  iVar2 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
  vLits1 = Vec_IntAlloc(iVar2);
  for (status = 0; iVar2 = Vec_IntSize(vInit1_local), status < iVar2; status = status + 1) {
    local_f4 = Vec_IntEntry(vInit1_local,status);
    pVVar1 = vLits1;
    iLit1 = local_f4;
    if (1 < local_f4) {
      local_f4 = Gia_ManAppendCi(pPart);
    }
    Vec_IntPush(pVVar1,local_f4);
  }
  iVar2 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
  vMiters = Vec_IntAlloc(iVar2);
  for (status = 0; iVar2 = Vec_IntSize(_nWords_local), status < iVar2; status = status + 1) {
    local_10c = Vec_IntEntry(_nWords_local,status);
    pVVar1 = vMiters;
    iLit1 = local_10c;
    if (1 < local_10c) {
      local_10c = Gia_ManAppendCi(pPart);
    }
    Vec_IntPush(pVVar1,local_10c);
  }
  vSatMap = Vec_IntAlloc(1000);
  vPartMap = Vec_IntAlloc(1000);
  vCopies = Vec_IntAlloc(1000);
  pNew = (Gia_Man_t *)Vec_IntAlloc(1000);
  nChanges = 0;
  do {
    if (nTimeOut_local <= nChanges) {
LAB_006bf935:
      sat_solver_delete(_iVar1);
      Gia_ManStopP(&pPart);
      Vec_IntFree(vLits1);
      Vec_IntFree(vMiters);
      Vec_IntFree(vSatMap);
      Vec_IntFree(vPartMap);
      Vec_IntFree(vCopies);
      Vec_IntFree((Vec_Int_t *)pNew);
      return clk._4_4_;
    }
    aVar6 = Abc_Clock();
    Bmc_BmciUnfold(pPart,(Gia_Man_t *)vInit0_local,vLits1,0);
    Bmc_BmciUnfold(pPart,(Gia_Man_t *)vInit0_local,vMiters,1);
    iVar2 = Vec_IntSize(vLits1);
    iVar3 = Vec_IntSize(vMiters);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(vLits0) == Vec_IntSize(vLits1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                    ,0xd7,
                    "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                   );
    }
    local_b0 = 0;
    Vec_IntClear(vSatMap);
    for (status = 0; iVar2 = Vec_IntSize(vLits1), status < iVar2; status = status + 1) {
      iVar2 = Vec_IntEntry(vLits1,status);
      iVar3 = Vec_IntEntry(vMiters,status);
      pVVar1 = vSatMap;
      if (((iVar2 < 2) && (iVar3 < 2)) || (iVar2 == iVar3)) {
        Vec_IntPush(vSatMap,-1);
      }
      else {
        iVar2 = Gia_ManHashXor(pPart,iVar2,iVar3);
        Vec_IntPush(pVVar1,iVar2);
        local_b0 = local_b0 + 1;
      }
    }
    iVar2 = Vec_IntSize(vSatMap);
    iVar3 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(vMiters) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                    ,0xdf,
                    "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                   );
    }
    iVar2 = Vec_IntSum(vSatMap);
    iVar3 = Vec_IntSize(vMiters);
    if (iVar2 + iVar3 == 0) {
      if (fVerbose != 0) {
        printf("Reached a fixed point after %d frames.  \n",(ulong)(nChanges + 1));
      }
      goto LAB_006bf935;
    }
    pObj = (Gia_Obj_t *)Bmc_BmciPart(pPart,vPartMap,vSatMap,vCopies,(Vec_Int_t *)pNew);
    pSat = (sat_solver *)Cnf_DeriveGiaRemapped((Gia_Man_t *)pObj);
    Cnf_DataLiftGia((Cnf_Dat_t *)pSat,(Gia_Man_t *)pObj,(uint)vLits0);
    vLits0._0_4_ = pSat->qhead + (uint)vLits0;
    sat_solver_setnvars(_iVar1,(uint)vLits0);
    for (status = 0; status < (pSat->Mem).nEntries[0]; status = status + 1) {
      iVar2 = sat_solver_addclause
                        (_iVar1,*(lit **)(*(long *)(pSat->Mem).BookMarkH + (long)status * 8),
                         *(lit **)(*(long *)(pSat->Mem).BookMarkH + (long)(status + 1) * 8));
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0xee,
                      "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                     );
      }
    }
    status = 0;
    while( true ) {
      iVar2 = Gia_ManPiNum((Gia_Man_t *)pObj);
      bVar10 = false;
      if (status < iVar2) {
        pCnf = (Cnf_Dat_t *)Gia_ManCi((Gia_Man_t *)pObj,status);
        bVar10 = pCnf != (Cnf_Dat_t *)0x0;
      }
      if (!bVar10) break;
      lVar5 = *(long *)(pSat->Mem).BookMarkE;
      iVar2 = Gia_ObjId((Gia_Man_t *)pObj,(Gia_Obj_t *)pCnf);
      p_00 = vPartMap;
      pVVar1 = vCopies;
      iLit = *(int *)(lVar5 + (long)iVar2 * 4);
      iVar2 = Gia_ObjId((Gia_Man_t *)pObj,(Gia_Obj_t *)pCnf);
      iVar2 = Vec_IntEntry(pVVar1,iVar2);
      iLit0 = Vec_IntEntry(p_00,iVar2);
      if (iLit0 != -1) {
        sat_solver_add_buffer(_iVar1,iLit,iLit0,0);
      }
      status = status + 1;
    }
    status = 0;
    while( true ) {
      bVar10 = false;
      if (status < *(int *)(pObj + 2)) {
        pCnf = (Cnf_Dat_t *)Gia_ManObj((Gia_Man_t *)pObj,status);
        bVar10 = pCnf != (Cnf_Dat_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ObjIsCand((Gia_Obj_t *)pCnf);
      if ((iVar2 != 0) && (-1 < *(int *)(*(long *)(pSat->Mem).BookMarkE + (long)status * 4))) {
        iVar2 = Gia_ObjIsCi((Gia_Obj_t *)pCnf);
        pVVar1 = vPartMap;
        if (iVar2 == 0) {
          iVar2 = Vec_IntEntry(vCopies,status);
          iVar2 = Vec_IntEntry(pVVar1,iVar2);
          if (iVar2 != -1) {
            __assert_fail("Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                          ,0xfc,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
        }
        pVVar1 = vPartMap;
        iVar2 = Vec_IntEntry(vCopies,status);
        Vec_IntWriteEntry(pVVar1,iVar2,*(int *)(*(long *)(pSat->Mem).BookMarkE + (long)status * 4));
      }
      status = status + 1;
    }
    Cnf_DataFree((Cnf_Dat_t *)pSat);
    Gia_ManStop((Gia_Man_t *)pObj);
    RetValue = 0;
    for (status = 0; iVar2 = Vec_IntSize(vSatMap), status < iVar2; status = status + 1) {
      iLit1 = Vec_IntEntry(vSatMap,status);
      pVVar1 = vPartMap;
      if (iLit1 == -1) {
        iLit1 = -1;
      }
      else {
        iVar2 = Abc_Lit2Var(iLit1);
        iVar2 = Vec_IntEntry(pVVar1,iVar2);
        if (iVar2 < 1) {
          __assert_fail("Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                        ,0x107,
                        "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                       );
        }
        pMap = Vec_IntArray(vPartMap);
        iLit1 = Abc_Lit2LitV(pMap,iLit1);
        iVar2 = sat_solver_solve(_iVar1,&iLit1,&iLit0,0,0,0,0);
        if (iVar2 == 1) {
          RetValue = RetValue + 1;
        }
        else {
          if (iVar2 == 0) {
            printf("Timeout reached after %d seconds.  \n",(ulong)vLits0._4_4_);
            clk._4_4_ = 0;
            goto LAB_006bf935;
          }
          if (iVar2 != -1) {
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                          ,0x115,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
          iVar2 = Vec_IntEntry(vLits1,status);
          iVar3 = Vec_IntEntry(vMiters,status);
          if (((iVar2 < 2) && (iVar3 < 2)) || (iVar2 == iVar3)) {
            __assert_fail("(iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                          ,0x118,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
          if (iVar3 < 2) {
            Vec_IntWriteEntry(vLits1,status,iVar3);
          }
          else {
            Vec_IntWriteEntry(vMiters,status,iVar2);
          }
          iVar2 = Vec_IntEntry(vLits1,status);
          iVar3 = Vec_IntEntry(vMiters,status);
          if (iVar2 != iVar3) {
            __assert_fail("iLit0 == iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                          ,0x11f,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
        }
      }
    }
    if (fVerbose != 0) {
      printf("Frame %4d : ",(ulong)(nChanges + 1));
      printf("Vars =%7d  ",(ulong)(uint)vLits0);
      uVar4 = sat_solver_nclauses(_iVar1);
      printf("Clause =%10d  ",(ulong)uVar4);
      uVar4 = sat_solver_nconflicts(_iVar1);
      printf("Conflict =%10d  ",(ulong)uVar4);
      uVar4 = Gia_ManAndNum(pPart);
      printf("AIG =%7d  ",(ulong)uVar4);
      printf("Miters =%5d  ",(ulong)local_b0);
      printf("SAT =%5d  ",(ulong)(uint)RetValue);
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar9 - aVar6);
    }
    if (RetValue == 0) {
      printf("Reached a fixed point after %d frames.  \n",(ulong)(nChanges + 1));
      goto LAB_006bf935;
    }
    nChanges = nChanges + 1;
  } while( true );
}

Assistant:

int Bmc_BmciPerform( Gia_Man_t * p, Vec_Int_t * vInit0, Vec_Int_t * vInit1, int nFrames, int nWords, int nTimeOut, int fVerbose )
{
    int nSatVars = 1;
    Vec_Int_t * vLits0, * vLits1, * vMiters, * vSatMap, * vPartMap, * vCopies;
    Gia_Man_t * pNew, * pPart;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int iVar0, iVar1, iLit, iLit0, iLit1;
    int i, f, status, nChanges, nMiters, RetValue = 1;
    assert( Vec_IntSize(vInit0) == Gia_ManRegNum(p) );
    assert( Vec_IntSize(vInit1) == Gia_ManRegNum(p) );

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;

    vLits0 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit0, iLit, i )
        Vec_IntPush( vLits0, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vLits1 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit1, iLit, i )
        Vec_IntPush( vLits1, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vMiters  = Vec_IntAlloc( 1000 );
    vSatMap  = Vec_IntAlloc( 1000 );
    vPartMap = Vec_IntAlloc( 1000 );
    vCopies  = Vec_IntAlloc( 1000 );
    for ( f = 0; f < nFrames; f++ )
    {
        abctime clk = Abc_Clock();
        Bmc_BmciUnfold( pNew, p, vLits0, 0 );
        Bmc_BmciUnfold( pNew, p, vLits1, 1 );
        assert( Vec_IntSize(vLits0) == Vec_IntSize(vLits1) );
        nMiters  = 0;
        Vec_IntClear( vMiters );
        Vec_IntForEachEntryTwo( vLits0, vLits1, iLit0, iLit1, i )
            if ( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 )
                Vec_IntPush( vMiters, Gia_ManHashXor(pNew, iLit0, iLit1) ), nMiters++;
            else
                Vec_IntPush( vMiters, -1 );
        assert( Vec_IntSize(vMiters) == Gia_ManRegNum(p) );
        if ( Vec_IntSum(vMiters) + Vec_IntSize(vLits1) == 0 )
        {
            if ( fVerbose )
                printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
        // create new part
        pPart = Bmc_BmciPart( pNew, vSatMap, vMiters, vPartMap, vCopies );
        pCnf = Cnf_DeriveGiaRemapped( pPart );
        Cnf_DataLiftGia( pCnf, pPart, nSatVars );
        nSatVars += pCnf->nVars;
        sat_solver_setnvars( pSat, nSatVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
        // stitch the clauses
        Gia_ManForEachPi( pPart, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pPart, pObj)];
            iVar1 = Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, Gia_ObjId(pPart, pObj)) );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // transfer variables
        Gia_ManForEachCand( pPart, pObj, i )
            if ( pCnf->pVarNums[i] >= 0 )
            {
                assert( Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1 );
                Vec_IntWriteEntry( vSatMap, Vec_IntEntry(vPartMap, i), pCnf->pVarNums[i] );
            }
        Cnf_DataFree( pCnf );
        Gia_ManStop( pPart );
        // perform runs
        nChanges = 0;
        Vec_IntForEachEntry( vMiters, iLit, i )
        {
            if ( iLit == -1 )
                continue;
            assert( Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0 );
            iLit = Abc_Lit2LitV( Vec_IntArray(vSatMap), iLit );
            status = sat_solver_solve( pSat, &iLit, &iLit + 1, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( status == l_True )
            {
                nChanges++;
                continue;
            }
            if ( status == l_Undef )
            {
                printf( "Timeout reached after %d seconds.  \n", nTimeOut );
                RetValue = 0;
                goto cleanup;
            }
            assert( status == l_False );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 );
            if ( iLit1 >= 2 )
                Vec_IntWriteEntry( vLits1, i, iLit0 );
            else
                Vec_IntWriteEntry( vLits0, i, iLit1 );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( iLit0 == iLit1 );
        }
        if ( fVerbose )
        {
            printf( "Frame %4d : ",     f+1 );
            printf( "Vars =%7d  ",      nSatVars );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "AIG =%7d  ",       Gia_ManAndNum(pNew) );
            printf( "Miters =%5d  ",    nMiters );
            printf( "SAT =%5d  ",       nChanges );
            Abc_PrintTime( 1, "Time",   Abc_Clock() - clk );
        }
        if ( nChanges == 0 )
        {
            printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
    }
cleanup:

    sat_solver_delete( pSat );
    Gia_ManStopP( &pNew );
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vMiters );
    Vec_IntFree( vSatMap );
    Vec_IntFree( vPartMap );
    Vec_IntFree( vCopies );
    return RetValue;
}